

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O1

shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::xpressive::detail::
  get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(void)

{
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_xpr_abi_cxx11_ == '\0') {
    get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
  }
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_ptr_abi_cxx11_ == '\0') {
    get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
  }
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_matchable_abi_cxx11_ == '\0') {
    get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
  }
  return &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
          invalid_matchable_abi_cxx11_;
}

Assistant:

inline shared_matchable<BidiIter> const &get_invalid_xpression()
{
    static invalid_xpression<BidiIter> const invalid_xpr;
    static intrusive_ptr<matchable_ex<BidiIter> const> const invalid_ptr(&invalid_xpr);
    static shared_matchable<BidiIter> const invalid_matchable(invalid_ptr);
    return invalid_matchable;
}